

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group_Type.cxx
# Opt level: O0

void __thiscall Fluid_Table::DrawData(Fluid_Table *this,char *s,int X,int Y,int W,int H)

{
  Fl_Color c;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  char *s_local;
  Fluid_Table *this_local;
  
  fl_push_clip(X,Y,W,H);
  fl_color(0xff);
  fl_rectf(X,Y,W,H);
  fl_color(0x20);
  fl_draw(s,X,Y,W,H,0,(Fl_Image *)0x0,1);
  c = Fl_Widget::color((Fl_Widget *)this);
  fl_color(c);
  fl_rect(X,Y,W,H);
  fl_pop_clip();
  return;
}

Assistant:

void DrawData(const char *s, int X, int Y, int W, int H) {
    fl_push_clip(X,Y,W,H);
    // Draw cell bg
    fl_color(FL_WHITE); fl_rectf(X,Y,W,H);
    // Draw cell data
    fl_color(FL_GRAY0); fl_draw(s, X,Y,W,H, FL_ALIGN_CENTER);
    // Draw box border
    fl_color(color()); fl_rect(X,Y,W,H);
    fl_pop_clip();
  }